

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::weakly_canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  path result;
  error_code tec;
  iterator __begin2;
  path local_d0;
  iterator __end2;
  string local_70 [32];
  path pe;
  
  result._path._M_dataplus._M_p = (pointer)&result._path.field_2;
  result._path._M_string_length = 0;
  result._path.field_2._M_local_buf[0] = '\0';
  std::error_code::clear(ec);
  path::begin(&__begin2,p);
  path::end(&__end2,p);
  paVar3 = &(__return_storage_ptr__->_path).field_2;
  bVar1 = true;
  while (__begin2._iter._M_current != __end2._iter._M_current) {
    std::__cxx11::string::string((string *)&pe,(string *)&__begin2._current);
    if (bVar1) {
      tec._M_value = 0;
      tec._M_cat = (error_category *)std::_V2::system_category();
      operator/((path *)local_70,&result,&pe);
      bVar2 = exists((path *)local_70,&tec);
      std::__cxx11::string::~string(local_70);
      if (bVar2) {
        path::operator/=(&result,&pe);
LAB_0014df2c:
        cVar4 = '\0';
      }
      else if (ec->_M_value == 0) {
        if (result._path._M_string_length == 0) {
          path::operator/=(&result,&pe);
          bVar1 = false;
          goto LAB_0014df2c;
        }
        canonical(&local_d0,&result,ec);
        operator/((path *)local_70,&local_d0,&pe);
        std::__cxx11::string::operator=((string *)&result,local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        cVar4 = (ec->_M_value != 0) * '\x02';
        bVar1 = false;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar3;
        (__return_storage_ptr__->_path)._M_string_length = 0;
        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
        cVar4 = '\x01';
      }
    }
    else {
      cVar4 = '\0';
      path::operator/=(&result,&pe);
    }
    std::__cxx11::string::~string((string *)&pe);
    if (cVar4 != '\0') goto LAB_0014dffa;
    path::iterator::operator++(&__begin2);
  }
  cVar4 = '\x02';
LAB_0014dffa:
  std::__cxx11::string::~string((string *)&__end2._current);
  std::__cxx11::string::~string((string *)&__begin2._current);
  if (cVar4 == '\x02') {
    if ((bVar1) && (result._path._M_string_length != 0)) {
      canonical((path *)&__begin2,&result,ec);
      std::__cxx11::string::operator=((string *)&result,(string *)&__begin2);
      std::__cxx11::string::~string((string *)&__begin2);
    }
    if (ec->_M_value == 0) {
      path::lexically_normal(__return_storage_ptr__,&result);
    }
    else {
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar3;
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    }
  }
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path weakly_canonical(const path& p, std::error_code& ec) noexcept
{
    path result;
    ec.clear();
    bool scan = true;
    for (auto pe : p) {
        if (scan) {
            std::error_code tec;
            if (exists(result / pe, tec)) {
                result /= pe;
            }
            else {
                if (ec) {
                    return path();
                }
                scan = false;
                if (!result.empty()) {
                    result = canonical(result, ec) / pe;
                    if (ec) {
                        break;
                    }
                }
                else {
                    result /= pe;
                }
            }
        }
        else {
            result /= pe;
        }
    }
    if (scan) {
        if (!result.empty()) {
            result = canonical(result, ec);
        }
    }
    return ec ? path() : result.lexically_normal();
}